

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O2

void Kf_SetSelectBest(Kf_Set_t *p,int fArea,int fSort)

{
  Kf_Cut_t *pKVar1;
  ushort uVar2;
  int iVar3;
  Kf_Cut_t *pKVar4;
  Kf_Cut_t *pKVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  Kf_Cut_t *t;
  int *piVar10;
  
  uVar7 = (ulong)p->nLutSize;
  pKVar1 = p->pCutsR;
  lVar8 = 0;
  uVar12 = 0;
  do {
    if (lVar8 == uVar7 + 1) {
      if (((int)uVar12 < 1) || (p->nCutNum <= uVar12)) {
        __assert_fail("nCuts > 0 && nCuts < p->nCutNum",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaKf.c"
                      ,0x124,"void Kf_SetSelectBest(Kf_Set_t *, int, int)");
      }
      p->nCuts = uVar12;
      p->pCutBest = p->ppCuts[0];
      for (lVar8 = 0; uVar7 + 1 != lVar8; lVar8 = lVar8 + 1) {
        p->pList[lVar8] = -1;
      }
      for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
        pKVar4 = p->ppCuts[uVar13];
        pKVar4->iNext = p->pList[pKVar4->nLeaves];
        p->pList[pKVar4->nLeaves] = (int)(((long)pKVar4 - (long)pKVar1) / 0x60);
      }
      p->nCuts = 0;
      lVar8 = 0;
      while( true ) {
        if ((int)uVar7 < 0) break;
        piVar10 = p->pList + uVar7;
        lVar8 = (long)(int)(uint)lVar8;
        while (lVar9 = (long)*piVar10, -1 < lVar9) {
          p->nCuts = (int)(lVar8 + 1);
          p->ppCuts[lVar8] = pKVar1 + lVar9;
          lVar8 = lVar8 + 1;
          piVar10 = &pKVar1[lVar9].iNext;
        }
        uVar7 = (ulong)((int)uVar7 - 1);
      }
      if ((uint)lVar8 == uVar12) {
        return;
      }
      __assert_fail("p->nCuts == nCuts",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaKf.c"
                    ,0x132,"void Kf_SetSelectBest(Kf_Set_t *, int, int)");
    }
    piVar10 = p->pList + lVar8;
    while (iVar3 = *piVar10, -1 < (long)iVar3) {
      uVar2 = p->nCutNum;
      p->ppCuts[(int)uVar12] = pKVar1 + iVar3;
      uVar6 = 1;
      if (uVar12 != 0) {
        uVar11 = uVar2 - 1;
        for (uVar13 = (ulong)uVar12; 0 < (int)uVar13; uVar13 = uVar13 - 1) {
          pKVar4 = p->ppCuts[uVar13 - 1];
          pKVar5 = p->ppCuts[uVar13];
          if (fArea == 0) {
            if (pKVar4->Delay < pKVar5->Delay) break;
            if (pKVar4->Delay <= pKVar5->Delay) {
              if ((pKVar4->nLeaves < pKVar5->nLeaves) ||
                 ((pKVar4->nLeaves <= pKVar5->nLeaves &&
                  (pKVar4->Area < pKVar5->Area || pKVar4->Area == pKVar5->Area)))) break;
            }
          }
          else {
            if (pKVar4->Area < pKVar5->Area) break;
            if (pKVar4->Area <= pKVar5->Area) {
              if ((pKVar4->Delay < pKVar5->Delay) ||
                 ((pKVar4->Delay <= pKVar5->Delay && (pKVar4->nLeaves <= pKVar5->nLeaves)))) break;
            }
          }
          p->ppCuts[uVar13 - 1] = pKVar5;
          p->ppCuts[uVar13] = pKVar4;
        }
        uVar6 = uVar12 + 1;
        if ((int)uVar11 <= (int)(uVar12 + 1)) {
          uVar6 = uVar11;
        }
      }
      uVar12 = uVar6;
      piVar10 = &pKVar1[iVar3].iNext;
    }
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

static inline void Kf_SetSelectBest( Kf_Set_t * p, int fArea, int fSort )
{
//    int fArea = p->pMan->pPars->fArea;
    Kf_Cut_t * pCut;
    int i, nCuts = 0;
    for ( i = 0; i <= p->nLutSize; i++ )
        Kf_ListForEachCut( p, i, pCut )
            nCuts = Kf_SetStoreAddOne( p, nCuts, p->nCutNum-1, pCut, fArea );
    assert( nCuts > 0 && nCuts < p->nCutNum );
    p->nCuts = nCuts;
    p->pCutBest = p->ppCuts[0];
    if ( !fSort )
        return;
    // sort by size in the reverse order
    for ( i = 0; i <= p->nLutSize; i++ )
        p->pList[i] = -1;
    for ( i = 0; i < nCuts; i++ )
        Kf_SetAddToList( p, p->ppCuts[i], 0 );
    p->nCuts = 0;
    for ( i = p->nLutSize; i >= 0; i-- )
        Kf_ListForEachCut( p, i, pCut )
            p->ppCuts[p->nCuts++] = pCut;
    assert( p->nCuts == nCuts );
}